

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# losertree.h
# Opt level: O1

uint __thiscall loser_tree<unsigned_char_*>::init_min(loser_tree<unsigned_char_*> *this,uint root)

{
  Stream *pSVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = root - this->_stream_offset;
  if (root < this->_stream_offset) {
    uVar2 = init_min(this,root * 2);
    uVar3 = init_min(this,root * 2 + 1);
    pSVar1 = this->_streams;
    if (pSVar1[uVar3].n == 0) {
      this->_nodes[root] = uVar3;
      uVar3 = uVar2;
    }
    else if (pSVar1[uVar2].n == 0) {
      this->_nodes[root] = uVar2;
    }
    else {
      if (*pSVar1[uVar2].stream == (uchar *)0x0) {
        __assert_fail("a != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_losertree.cpp"
                      ,0x23,"int cmp(const unsigned char *, const unsigned char *)");
      }
      if (*pSVar1[uVar3].stream == (uchar *)0x0) {
        __assert_fail("b != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_losertree.cpp"
                      ,0x24,"int cmp(const unsigned char *, const unsigned char *)");
      }
      iVar4 = strcmp((char *)*pSVar1[uVar2].stream,(char *)*pSVar1[uVar3].stream);
      if (iVar4 < 1) {
        this->_nodes[root] = uVar3;
        uVar3 = uVar2;
      }
      else {
        this->_nodes[root] = uVar2;
      }
    }
  }
  return uVar3;
}

Assistant:

unsigned init_min(unsigned root)
	{
		if (root >= _stream_offset) { return root-_stream_offset; }
		//debug() << __PRETTY_FUNCTION__ << " root="<<root<<"\n";
		const unsigned l = init_min(root << 1);
		const unsigned r = init_min((root << 1) + 1);
		if (stream_empty(_streams[r])) {
			_nodes[root] = r;
			return l;
		}
		if (stream_empty(_streams[l])) {
			_nodes[root] = l;
			return r;
		}
		if (cmp(*(_streams[l].stream), *(_streams[r].stream)) <= 0) {
			_nodes[root] = r;
			return l;
		}
		_nodes[root] = l;
		return r;
	}